

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MammalHandler.cpp
# Opt level: O2

void __thiscall MammalHandler::handleRequest(MammalHandler *this,string *name)

{
  pointer pbVar1;
  AnimalHandler *pAVar2;
  __type _Var3;
  pointer pbVar4;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> i;
  
  pbVar1 = (this->super_AnimalHandler).nameList.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (this->super_AnimalHandler).nameList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    std::__cxx11::string::string((string *)local_78,(string *)pbVar4);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78,name);
    if (_Var3) {
      std::operator<<((ostream *)&std::cout,"class::MammalHandler  method::handleRequest\n");
    }
    std::__cxx11::string::~string((string *)local_78);
  }
  pAVar2 = (this->super_AnimalHandler).myHandler;
  if (pAVar2 != (AnimalHandler *)0x0) {
    std::__cxx11::string::string((string *)(i.field_2._M_local_buf + 8),(string *)name);
    (*pAVar2->_vptr_AnimalHandler[2])(pAVar2,(string *)(i.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(i.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void MammalHandler::handleRequest(std::string name) {
    for (auto i : nameList) {
        if (i == name) {
            std::cout << "class::MammalHandler  method::handleRequest\n";
        }
    }
    if (myHandler != nullptr) {
        myHandler->handleRequest(name);
    }
}